

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<std::error_code_(long)>::PerformDefaultAction
          (FunctionMocker<std::error_code_(long)> *this,ArgumentTuple *args,string *call_description
          )

{
  OnCallSpec<std::error_code_(long)> *this_00;
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  Action<std::error_code_(long)> *this_01;
  error_category *peVar4;
  error_category *extraout_RDX;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  Result RVar6;
  Result RVar7;
  string message;
  long *local_50 [2];
  long local_40 [2];
  _Head_base<0UL,_long,_false> local_30;
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar1 = (call_description->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + call_description->_M_string_length);
      std::__cxx11::string::append((char *)local_50);
      if (DefaultValue<std::error_code>::producer_ == (long *)0x0) {
        peVar4 = (error_category *)std::_V2::system_category();
        uVar3 = 0;
      }
      else {
        uVar3 = (**(code **)(*DefaultValue<std::error_code>::producer_ + 0x10))();
        peVar4 = extraout_RDX;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      goto LAB_00129b58;
    }
    this_00 = (OnCallSpec<std::error_code_(long)> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar2 = OnCallSpec<std::error_code_(long)>::Matches(this_00,args);
  } while (!bVar2);
  this_01 = OnCallSpec<std::error_code_(long)>::GetAction(this_00);
  local_30._M_head_impl =
       (args->super__Tuple_impl<0UL,_long>).super__Head_base<0UL,_long,_false>._M_head_impl;
  RVar6 = Action<std::error_code_(long)>::Perform(this_01,(ArgumentTuple *)&local_30);
  peVar4 = RVar6._M_cat;
  uVar3 = RVar6._M_value;
LAB_00129b58:
  RVar7._4_4_ = 0;
  RVar7._M_value = uVar3;
  RVar7._M_cat = peVar4;
  return RVar7;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }